

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default.cpp
# Opt level: O2

void fill_stack(string *filename,int data,char delimeter)

{
  int iVar1;
  istream *piVar2;
  mapped_type *pmVar3;
  int (*paiVar4) [8];
  long lVar5;
  mapped_type mVar6;
  long lVar7;
  bool bVar8;
  string line;
  string word;
  stringstream str;
  ifstream file;
  
  std::ifstream::ifstream(&file,(string *)filename,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  mVar6 = 0;
  line.field_2._M_local_buf[0] = '\0';
  word._M_dataplus._M_p = (pointer)&word.field_2;
  word._M_string_length = 0;
  word.field_2._M_local_buf[0] = '\0';
  do {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&file,(string *)&line);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
      std::__cxx11::string::~string((string *)&word);
      std::__cxx11::string::~string((string *)&line);
      std::ifstream::~ifstream(&file);
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&str,(string *)&line,_S_out|_S_in);
    lVar7 = 0;
    lVar5 = -4;
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&str,(string *)&word,delimeter);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      bVar8 = lVar7 == 0;
      lVar7 = lVar7 + -1;
      if (bVar8) {
        bVar8 = std::operator==(&word,"Pairs");
        if (bVar8) break;
        pmVar3 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pair2pos_abi_cxx11_,&word);
        mVar6 = *pmVar3;
      }
      else {
        if (data == 0) {
          iVar1 = std::__cxx11::stoi(&word,(size_t *)0x0,10);
          paiVar4 = stack37;
        }
        else {
          iVar1 = std::__cxx11::stoi(&word,(size_t *)0x0,10);
          paiVar4 = stackdH;
        }
        *(int *)((long)paiVar4[mVar6] + lVar5) = iVar1;
      }
      lVar5 = lVar5 + 4;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&str);
  } while( true );
}

Assistant:

void fill_stack(const string &filename, int data, char delimeter) {
    ifstream file(filename);

//    cout << data << endl;

    string line, word;
    int idx = 0, cidx = 0;

    while (getline(file, line)) {
        stringstream str(line);
        idx = 0;
        while(getline(str, word, delimeter)) {
            if (idx == 0 && word == "Pairs") break;
            if (idx == 0) {
                cidx = pair2pos[word];
            } else {
                if (!data) {
//                    cout << idx << " " << word << endl;
                    stack37[cidx][idx-1] = stoi(word);
                } else {
                    stackdH[cidx][idx-1] = stoi(word);
                }

            }
            idx += 1;
        }

    }
}